

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O2

void amrex::VisMF::ReadFAHeader(string *fafabName,Vector<char,_std::allocator<char>_> *faHeader)

{
  MPI_Comm local_34;
  string FullHdrFileName;
  
  std::operator+(&FullHdrFileName,fafabName,"_H");
  local_34 = ParallelDescriptor::m_comm;
  ParallelDescriptor::ReadAndBcastFile(&FullHdrFileName,faHeader,true,&local_34);
  std::__cxx11::string::~string((string *)&FullHdrFileName);
  return;
}

Assistant:

void
VisMF::ReadFAHeader (const std::string &fafabName,
                     Vector<char> &faHeader)
{
//    BL_PROFILE("VisMF::ReadFAHeader()");

    std::string FullHdrFileName(fafabName + TheMultiFabHdrFileSuffix);
    ParallelDescriptor::ReadAndBcastFile(FullHdrFileName, faHeader);
}